

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O0

void __thiscall
icu_63::SimpleTimeZone::setStartRule
          (SimpleTimeZone *this,int32_t month,int32_t dayOfMonth,int32_t time,TimeMode mode,
          UErrorCode *status)

{
  UErrorCode *status_local;
  TimeMode mode_local;
  int32_t time_local;
  int32_t dayOfMonth_local;
  int32_t month_local;
  SimpleTimeZone *this_local;
  
  setStartRule(this,month,dayOfMonth,0,time,mode,status);
  return;
}

Assistant:

void 
SimpleTimeZone::setStartRule(int32_t month, int32_t dayOfMonth, 
                             int32_t time, TimeMode mode, UErrorCode& status) 
{
    setStartRule(month, dayOfMonth, 0, time, mode, status);
}